

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall StringPieceUtilTestJoinStringPiece::Run(StringPieceUtilTestJoinStringPiece *this)

{
  pointer *str;
  Test *pTVar1;
  bool bVar2;
  string local_230;
  StringPiece local_210;
  undefined1 local_200 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_2;
  undefined1 local_1e0 [8];
  string sep;
  StringPiece local_1a0;
  undefined1 local_190 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> single_list;
  undefined1 local_170 [8];
  string one;
  undefined1 local_130 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> empty_list;
  StringPiece local_f8;
  undefined1 local_e8 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_1;
  string empty;
  string local_90;
  StringPiece local_70;
  undefined1 local_60 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  StringPieceUtilTestJoinStringPiece *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"a:b:c",&local_31);
  std::allocator<char>::~allocator(&local_31);
  StringPiece::StringPiece(&local_70,(string *)local_30);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,local_70,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            (&local_90,(vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,':');
  bVar2 = std::operator==("a:b:c",&local_90);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x50,"\"a:b:c\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&local_90);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&empty.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,'/');
  bVar2 = std::operator==("a/b/c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&empty.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x51,"\"a/b/c\" == JoinStringPiece(list, \'/\')");
  std::__cxx11::string::~string((string *)(empty.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  str = &list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)str);
  StringPiece::StringPiece(&local_f8,(string *)str);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e8,local_f8,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)
             &empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_e8,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &empty_list.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x58,"\"\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string
            ((string *)
             &empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e8);
  std::__cxx11::string::~string
            ((string *)
             &list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_130);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&one.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_130,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&one.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x5e,"\"\" == JoinStringPiece(empty_list, \':\')");
  std::__cxx11::string::~string((string *)(one.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,"a",
             (allocator<char> *)
             ((long)&single_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&single_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_1a0,(string *)local_170);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_190,local_1a0,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&sep.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_190,':');
  bVar2 = std::operator==("a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&sep.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x65,"\"a\" == JoinStringPiece(single_list, \':\')");
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_190);
  std::__cxx11::string::~string((string *)local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e0,":a:b:c:",
             (allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_210,(string *)local_1e0);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_200,local_210,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            (&local_230,(vector<StringPiece,_std::allocator<StringPiece>_> *)local_200,':');
  bVar2 = std::operator==(":a:b:c:",&local_230);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x6c,"\":a:b:c:\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&local_230);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_200);
  std::__cxx11::string::~string((string *)local_1e0);
  return;
}

Assistant:

TEST(StringPieceUtilTest, JoinStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ("a:b:c", JoinStringPiece(list, ':'));
    EXPECT_EQ("a/b/c", JoinStringPiece(list, '/'));
  }

  {
    string empty;
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ("", JoinStringPiece(list, ':'));
  }

  {
    vector<StringPiece> empty_list;

    EXPECT_EQ("", JoinStringPiece(empty_list, ':'));
  }

  {
    string one("a");
    vector<StringPiece> single_list = SplitStringPiece(one, ':');

    EXPECT_EQ("a", JoinStringPiece(single_list, ':'));
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(":a:b:c:", JoinStringPiece(list, ':'));
  }
}